

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O0

void __thiscall embree::ISPCTriangleMesh::~ISPCTriangleMesh(ISPCTriangleMesh *this)

{
  ISPCGeometry *in_RDI;
  size_t i_1;
  size_t i;
  ulong local_18;
  ulong local_10;
  
  if (*(long *)(in_RDI + 1) != 0) {
    for (local_10 = 0; local_10 < in_RDI[2].materialID; local_10 = local_10 + 1) {
      alignedUSMFree((void *)0x1885dc);
    }
    alignedUSMFree((void *)0x1885fe);
  }
  if (in_RDI[1].geometry != (RTCGeometry)0x0) {
    for (local_18 = 0; local_18 < in_RDI[2].materialID; local_18 = local_18 + 1) {
      alignedUSMFree((void *)0x188640);
    }
    alignedUSMFree((void *)0x188662);
  }
  alignedUSMFree((void *)0x188674);
  alignedUSMFree((void *)0x188684);
  ISPCGeometry::~ISPCGeometry(in_RDI);
  return;
}

Assistant:

ISPCTriangleMesh::~ISPCTriangleMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }
    
    if (normals) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(normals[i]);
      alignedUSMFree(normals);
    }

    alignedUSMFree(texcoords);
    alignedUSMFree(triangles);
  }